

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *window;
  long lVar3;
  _GLFWfbconfig *p_Var4;
  _GLFWfbconfig *p_Var5;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig local_3f8;
  _GLFWfbconfig local_3b8;
  _GLFWwndconfig local_370;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return (GLFWwindow *)0x0;
  }
  if (width < 1 || height < 1) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
    return (GLFWwindow *)0x0;
  }
  p_Var4 = &_glfw.hints.framebuffer;
  p_Var5 = &local_3b8;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    iVar2 = p_Var4->greenBits;
    p_Var5->redBits = p_Var4->redBits;
    p_Var5->greenBits = iVar2;
    p_Var4 = (_GLFWfbconfig *)&p_Var4->blueBits;
    p_Var5 = (_GLFWfbconfig *)&p_Var5->blueBits;
  }
  local_3f8._48_8_ = _glfw.hints.context._48_8_;
  local_3f8._32_8_ = _glfw.hints.context._32_8_;
  local_3f8.share = _glfw.hints.context.share;
  local_3f8._16_8_ = _glfw.hints.context._16_8_;
  local_3f8._24_8_ = _glfw.hints.context._24_8_;
  local_3f8._0_8_ = _glfw.hints.context._0_8_;
  local_3f8._8_8_ = _glfw.hints.context._8_8_;
  memcpy(&local_370,&_glfw.hints.window,0x340);
  local_3f8.share = (_GLFWwindow *)share;
  local_370.width = width;
  local_370.height = height;
  local_370.title = title;
  GVar1 = _glfwIsValidContextConfig(&local_3f8);
  if (GVar1 != 0) {
    window = (_GLFWwindow *)calloc(1,0x398);
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;
    (window->videoMode).width = width;
    (window->videoMode).height = height;
    (window->videoMode).redBits = local_3b8.redBits;
    (window->videoMode).greenBits = local_3b8.greenBits;
    (window->videoMode).blueBits = local_3b8.blueBits;
    (window->videoMode).refreshRate = _glfw.hints.refreshRate;
    window->monitor = (_GLFWmonitor *)monitor;
    window->resizable = local_370.resizable;
    window->decorated = local_370.decorated;
    window->autoIconify = local_370.autoIconify;
    window->floating = local_370.floating;
    window->focusOnShow = local_370.focusOnShow;
    window->cursorMode = 0x34001;
    window->minwidth = -1;
    window->minheight = -1;
    window->maxwidth = -1;
    window->maxheight = -1;
    window->numer = -1;
    window->denom = -1;
    iVar2 = _glfwPlatformCreateWindow(window,&local_370,&local_3f8,&local_3b8);
    if ((iVar2 != 0) &&
       ((local_3f8.client == 0 ||
        (GVar1 = _glfwRefreshContextAttribs(window,&local_3f8), GVar1 != 0)))) {
      if (window->monitor != (_GLFWmonitor *)0x0) {
        if (local_370.centerCursor == 0) {
          return (GLFWwindow *)window;
        }
        _glfwCenterCursorInContentArea(window);
        return (GLFWwindow *)window;
      }
      if (local_370.visible == 0) {
        return (GLFWwindow *)window;
      }
      _glfwPlatformShowWindow(window);
      if (local_370.focused == 0) {
        return (GLFWwindow *)window;
      }
      _glfwPlatformFocusWindow(window);
      return (GLFWwindow *)window;
    }
    glfwDestroyWindow((GLFWwindow *)window);
  }
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->focusOnShow = wndconfig.focusOnShow;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        if (!_glfwRefreshContextAttribs(window, &ctxconfig))
        {
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }
    }

    if (window->monitor)
    {
        if (wndconfig.centerCursor)
            _glfwCenterCursorInContentArea(window);
    }
    else
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}